

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManPrintInit(Nf_Man_t *p)

{
  Vec_Wec_t *p_00;
  int *piVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  int i;
  int i_00;
  int Counter;
  int iVar5;
  uint uVar6;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)p->pPars->nRounds);
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    printf("Cells = %d  ",(ulong)(uint)p->nCells);
    printf("Funcs = %d  ",(ulong)(uint)p->vTtMem->nEntries);
    p_00 = p->vTt2Match;
    iVar5 = 0;
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      pVVar3 = Vec_WecEntry(p_00,i_00);
      iVar5 = iVar5 + pVVar3->nSize;
    }
    uVar6 = 0;
    printf("Matches = %d  ",(long)iVar5 / 2 & 0xffffffff,(long)iVar5 % 2 & 0xffffffff);
    uVar2 = Gia_ManAndNum(p->pGia);
    printf("And = %d  ",(ulong)uVar2);
    piVar1 = p->pGia->pSibls;
    if (piVar1 != (int *)0x0) {
      uVar2 = p->pGia->nObjs;
      if ((int)uVar2 < 1) {
        uVar2 = uVar6;
      }
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        uVar6 = uVar6 + (0 < piVar1[uVar4]);
      }
      if (uVar6 != 0) {
        printf("Choices = %d  ",(ulong)uVar6);
      }
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Nf_ManPrintInit( Nf_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds );//+ p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    printf( "Cells = %d  ",   p->nCells );
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    printf( "Matches = %d  ", Vec_WecSizeSize(p->vTt2Match)/2 );
    printf( "And = %d  ",     Gia_ManAndNum(p->pGia) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}